

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::record_ycbcr_conversion
          (StateRecorder *this,VkSamplerYcbcrConversion conv,
          VkSamplerYcbcrConversionCreateInfo *create_info)

{
  void *pvVar1;
  VkStructureType VVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  VkFilter VVar7;
  VkBool32 VVar8;
  undefined4 uVar9;
  VkComponentSwizzle VVar10;
  VkComponentSwizzle VVar11;
  VkFormat VVar12;
  VkSamplerYcbcrModelConversion VVar13;
  VkSamplerYcbcrRange VVar14;
  VkComponentSwizzle VVar15;
  int iVar16;
  mapped_type pVVar17;
  mapped_type *ppVVar18;
  mutex *__mutex;
  VkSamplerYcbcrConversion local_28;
  
  __mutex = &this->impl->record_lock;
  local_28 = conv;
  iVar16 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar16 == 0) {
    pVVar17 = (mapped_type)
              ScratchAllocator::allocate_raw(&this->impl->ycbcr_temp_allocator,0x40,0x10);
    if (pVVar17 != (mapped_type)0x0) {
      VVar2 = create_info->sType;
      uVar3 = *(undefined4 *)&create_info->field_0x4;
      uVar4 = *(undefined4 *)&create_info->pNext;
      uVar5 = *(undefined4 *)((long)&create_info->pNext + 4);
      VVar12 = create_info->format;
      VVar13 = create_info->ycbcrModel;
      VVar14 = create_info->ycbcrRange;
      VVar15 = (create_info->components).r;
      VVar10 = (create_info->components).g;
      VVar11 = (create_info->components).b;
      uVar6 = *(undefined8 *)&(create_info->components).a;
      VVar7 = create_info->chromaFilter;
      VVar8 = create_info->forceExplicitReconstruction;
      uVar9 = *(undefined4 *)&create_info->field_0x3c;
      pVVar17->yChromaOffset = create_info->yChromaOffset;
      pVVar17->chromaFilter = VVar7;
      pVVar17->forceExplicitReconstruction = VVar8;
      *(undefined4 *)&pVVar17->field_0x3c = uVar9;
      (pVVar17->components).g = VVar10;
      (pVVar17->components).b = VVar11;
      *(undefined8 *)&(pVVar17->components).a = uVar6;
      pVVar17->format = VVar12;
      pVVar17->ycbcrModel = VVar13;
      pVVar17->ycbcrRange = VVar14;
      (pVVar17->components).r = VVar15;
      pVVar17->sType = VVar2;
      *(undefined4 *)&pVVar17->field_0x4 = uVar3;
      *(undefined4 *)&pVVar17->pNext = uVar4;
      *(undefined4 *)((long)&pVVar17->pNext + 4) = uVar5;
    }
    pvVar1 = create_info->pNext;
    if (pvVar1 == (void *)0x0) {
      ppVVar18 = std::__detail::
                 _Map_base<VkSamplerYcbcrConversion_T_*,_std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<VkSamplerYcbcrConversion_T_*,_std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->impl->ycbcr_conversions,&local_28);
      *ppVVar18 = pVVar17;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      Impl::pump_synchronized_recording(this->impl,this);
    }
    else {
      std::
      _Hashtable<VkSamplerYcbcrConversion_T_*,_std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase();
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    return pvVar1 == (void *)0x0;
  }
  std::__throw_system_error(iVar16);
}

Assistant:

bool StateRecorder::record_ycbcr_conversion(VkSamplerYcbcrConversion conv,
                                            const VkSamplerYcbcrConversionCreateInfo &create_info)
{
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkSamplerYcbcrConversionCreateInfo *new_info = nullptr;
		if (!impl->copy_ycbcr_conversion(&create_info, impl->ycbcr_temp_allocator, &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			impl->ycbcr_conversions.erase(conv);
			return false;
		}

		// We don't directly serialize these objects. Just remember it for later if a VkSampler is created.
		impl->ycbcr_conversions[conv] = new_info;
	}

	impl->pump_synchronized_recording(this);
	return true;
}